

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O3

int __thiscall
TPZMatrix<std::complex<long_double>_>::Decompose_LU(TPZMatrix<std::complex<long_double>_> *this)

{
  undefined8 uVar1;
  longdouble lVar2;
  byte bVar3;
  undefined8 in_R8;
  undefined8 in_R9;
  long lVar4;
  long lVar5;
  long lVar6;
  longdouble in_ST0;
  longdouble lVar7;
  longdouble in_ST1;
  longdouble lVar8;
  longdouble in_ST2;
  longdouble lVar9;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble lVar10;
  complex<long_double> __r_1;
  complex<long_double> __r;
  undefined4 uVar11;
  undefined2 uVar12;
  undefined4 uVar13;
  undefined2 uVar14;
  undefined4 local_118;
  undefined4 uStack_114;
  undefined2 uStack_110;
  undefined2 uStack_10e;
  undefined2 uStack_10c;
  undefined2 uStack_10a;
  undefined4 local_108;
  undefined4 uStack_104;
  undefined2 uStack_100;
  undefined2 uStack_fe;
  undefined2 uStack_fc;
  undefined2 uStack_fa;
  undefined4 local_f8;
  undefined2 uStack_f4;
  undefined2 uStack_f2;
  undefined2 uStack_f0;
  undefined2 uStack_ee;
  undefined4 uStack_ec;
  undefined4 local_e8;
  undefined4 uStack_e4;
  undefined2 uStack_e0;
  undefined2 uStack_de;
  undefined4 uStack_dc;
  complex<long_double> local_d8;
  undefined8 local_b8;
  undefined2 uStack_b0;
  undefined4 uStack_ae;
  undefined2 uStack_aa;
  undefined8 local_a8;
  undefined2 uStack_a0;
  undefined4 uStack_9e;
  undefined2 uStack_9a;
  long local_90;
  long local_88;
  longdouble local_7c;
  unkbyte10 local_64;
  complex<long_double> local_58;
  
  bVar3 = (this->super_TPZBaseMatrix).fDecomposed;
  if (1 < bVar3) {
    Error("Decompose_LU <Matrix already Decomposed with other scheme>",(char *)0x0);
    bVar3 = (this->super_TPZBaseMatrix).fDecomposed;
  }
  if (bVar3 == 0) {
    local_b8 = SUB108((longdouble)0,0);
    uStack_b0 = (undefined2)((unkuint10)(longdouble)0 >> 0x40);
    local_90 = (this->super_TPZBaseMatrix).fRow;
    lVar4 = (this->super_TPZBaseMatrix).fCol;
    if (lVar4 < local_90) {
      local_90 = lVar4;
    }
    if (0 < local_90) {
      local_7c = (longdouble)1e-16;
      lVar4 = 0;
      local_a8 = local_b8;
      uStack_a0 = uStack_b0;
      do {
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                  (&local_f8,this,lVar4,lVar4);
        uVar1 = CONCAT26(uStack_f2,CONCAT24(uStack_f4,local_f8));
        local_64 = CONCAT28(uStack_f0,uVar1);
        local_118 = local_f8;
        uStack_114 = (undefined4)((ulong)uVar1 >> 0x20);
        uStack_110 = uStack_f0;
        local_108 = local_e8;
        uStack_104 = uStack_e4;
        uStack_100 = uStack_e0;
        lVar10 = in_ST4;
        uVar11 = local_f8;
        uVar12 = uStack_f0;
        uVar13 = local_e8;
        uVar14 = uStack_e0;
        cabsl();
        lVar7 = ABS(in_ST0);
        in_ST0 = in_ST1;
        lVar8 = in_ST2;
        lVar9 = in_ST3;
        lVar2 = in_ST4;
        if (lVar7 < local_7c) {
          Error("Decompose_LU <matrix is singular>",(char *)0x0);
          in_ST0 = in_ST1;
          lVar8 = in_ST2;
          lVar9 = in_ST3;
          lVar2 = in_ST4;
        }
        in_ST4 = lVar10;
        in_ST3 = lVar2;
        in_ST2 = lVar9;
        in_ST1 = lVar8;
        lVar5 = lVar4 + 1;
        lVar6 = lVar5;
        lVar8 = in_ST0;
        lVar9 = in_ST1;
        lVar2 = in_ST2;
        if (lVar5 < (this->super_TPZBaseMatrix).fRow) {
          do {
            local_88 = lVar6;
            in_ST2 = in_ST4;
            in_ST1 = in_ST3;
            in_ST0 = lVar2;
            lVar6 = local_88;
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                      (&local_118,this,lVar5,lVar4,in_R8,in_R9,uVar11,uVar12,uVar13,uVar14);
            local_f8 = CONCAT22(uStack_10c,uStack_10e);
            uStack_f4 = uStack_10a;
            local_d8._M_value._2_2_ = uStack_fc;
            local_d8._M_value._0_2_ = uStack_fe;
            local_d8._M_value._4_2_ = uStack_fa;
            in_ST3 = in_ST2;
            in_ST4 = in_ST2;
            uVar11 = local_118;
            uVar12 = uStack_110;
            uVar13 = local_108;
            uVar14 = uStack_100;
            __divxc3();
            local_b8 = SUB108(lVar8,0);
            uStack_b0 = (undefined2)((unkuint10)lVar8 >> 0x40);
            uStack_ae = local_f8;
            uStack_aa = uStack_f4;
            local_a8 = SUB108(lVar9,0);
            uStack_a0 = (undefined2)((unkuint10)lVar9 >> 0x40);
            uStack_9e = local_d8._M_value._0_4_;
            uStack_9a = local_d8._M_value._4_2_;
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                      (this,lVar5,lVar4,&local_b8);
            if (lVar6 < (this->super_TPZBaseMatrix).fCol) {
              do {
                (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                          (&local_f8,this,lVar5,lVar6);
                (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                          (&local_58,this,lVar4,lVar6);
                local_d8._M_value._16_8_ = local_a8;
                local_d8._M_value._24_2_ = uStack_a0;
                local_d8._M_value._26_6_ =
                     SUB86(CONCAT26(uStack_9a,CONCAT42(uStack_9e,uStack_a0)) >> 0x10,0);
                local_d8._M_value._0_4_ = SUB84(local_b8,0);
                local_d8._M_value._4_2_ = SUB82(local_b8,4);
                local_d8._M_value._6_2_ = SUB82(local_b8,6);
                local_d8._M_value._8_2_ = uStack_b0;
                local_d8._M_value._10_6_ =
                     SUB86(CONCAT26(uStack_aa,CONCAT42(uStack_ae,uStack_b0)) >> 0x10,0);
                std::complex<long_double>::operator*=(&local_d8,&local_58);
                uStack_10e = uStack_ee;
                uStack_10c = (undefined2)uStack_ec;
                uStack_10a = (undefined2)((uint)uStack_ec >> 0x10);
                uStack_fe = uStack_de;
                uStack_fc = (undefined2)uStack_dc;
                uStack_fa = (undefined2)((uint)uStack_dc >> 0x10);
                lVar9 = (longdouble)
                        CONCAT28(uStack_f0,CONCAT44(CONCAT22(uStack_f2,uStack_f4),local_f8)) -
                        (longdouble)
                        CONCAT28(local_d8._M_value._8_2_,
                                 CONCAT26(local_d8._M_value._6_2_,
                                          CONCAT24(local_d8._M_value._4_2_,local_d8._M_value._0_4_))
                                );
                lVar8 = (longdouble)CONCAT28(uStack_e0,CONCAT44(uStack_e4,local_e8)) -
                        (longdouble)CONCAT28(local_d8._M_value._24_2_,local_d8._M_value._16_8_);
                local_118 = SUB104(lVar9,0);
                uStack_114 = (undefined4)((unkuint10)lVar9 >> 0x20);
                uStack_110 = (undefined2)((unkuint10)lVar9 >> 0x40);
                local_108 = SUB104(lVar8,0);
                uStack_104 = (undefined4)((unkuint10)lVar8 >> 0x20);
                uStack_100 = (undefined2)((unkuint10)lVar8 >> 0x40);
                (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                          (this,lVar5,lVar6,&local_118);
                lVar6 = lVar6 + 1;
              } while (lVar6 < (this->super_TPZBaseMatrix).fCol);
            }
            lVar5 = lVar5 + 1;
            lVar6 = local_88;
            lVar8 = in_ST0;
            lVar9 = in_ST1;
            lVar2 = in_ST2;
          } while (lVar5 < (this->super_TPZBaseMatrix).fRow);
        }
        lVar4 = lVar6;
      } while (lVar6 != local_90);
    }
    (this->super_TPZBaseMatrix).fDecomposed = '\x01';
  }
  return 1;
}

Assistant:

int TPZMatrix<TVar>::Decompose_LU() {
	
	if (  fDecomposed && fDecomposed != ELU)  Error( "Decompose_LU <Matrix already Decomposed with other scheme>" );
	if (fDecomposed) return 1;
	
	TVar nn, pivot;
	int64_t  min = ( Cols() < (Rows()) ) ? Cols() : Rows();
	
	for ( int64_t k = 0; k < min ; k++ ) {
		if (IsZero( pivot = GetVal(k, k))) Error( "Decompose_LU <matrix is singular>" );
		for ( int64_t i = k+1; i < Rows(); i++ ) {
			nn = GetVal( i, k ) / pivot;
			PutVal( i, k, nn );
			for ( int64_t j = k+1; j < Cols(); j++ ) PutVal(i,j,GetVal(i,j)-nn*GetVal(k,j));
		}
	}
	fDecomposed=ELU;
	return 1;
}